

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STGV.cpp
# Opt level: O2

void __thiscall STGV::STGV(STGV *this,ASTNode *root)

{
  SymbolTable *this_00;
  Detector *pDVar1;
  ASTNode *pAVar2;
  
  (this->super_Visitor)._vptr_Visitor = (_func_int **)&PTR_visit_001456f0;
  (this->currentFuncName)._M_dataplus._M_p = (pointer)&(this->currentFuncName).field_2;
  (this->currentFuncName)._M_string_length = 0;
  (this->currentFuncName).field_2._M_local_buf[0] = '\0';
  (this->currentNamespace)._M_dataplus._M_p = (pointer)&(this->currentNamespace).field_2;
  (this->currentNamespace)._M_string_length = 0;
  (this->currentNamespace).field_2._M_local_buf[0] = '\0';
  this_00 = (SymbolTable *)operator_new(0x78);
  (this_00->freeFunctions)._M_h._M_rehash_policy._M_next_resize = 0;
  (this_00->freeFunctions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this_00->freeFunctions)._M_h._M_element_count = 0;
  *(undefined8 *)&(this_00->freeFunctions)._M_h._M_rehash_policy = 0;
  (this_00->freeFunctions)._M_h._M_bucket_count = 0;
  (this_00->freeFunctions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this_00->classes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this_00->freeFunctions)._M_h._M_buckets = (__buckets_ptr)0x0;
  *(undefined8 *)&(this_00->classes)._M_h._M_rehash_policy = 0;
  (this_00->classes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this_00->classes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this_00->classes)._M_h._M_element_count = 0;
  (this_00->classes)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this_00->classes)._M_h._M_bucket_count = 0;
  this_00->main = (Function *)0x0;
  Semantic::SymbolTable::SymbolTable(this_00);
  this->symbolTable = this_00;
  pDVar1 = (Detector *)operator_new(0x48);
  (pDVar1->warnings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pDVar1->warnings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pDVar1->errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pDVar1->warnings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pDVar1->errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pDVar1->errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pDVar1->symbolTable = this_00;
  this->detector = pDVar1;
  pAVar2 = AST::ASTNode::getChild(root,0);
  (**pAVar2->_vptr_ASTNode)(pAVar2,this);
  return;
}

Assistant:

STGV::STGV(AST::ASTNode *root) {
    this->symbolTable = new Semantic::SymbolTable();
    this->detector = new Semantic::Detector(this->symbolTable);
    root->getChild(0)->accept(*this);
}